

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

QSize __thiscall QDockAreaLayoutInfo::maximumSize(QDockAreaLayoutInfo *this)

{
  Orientation OVar1;
  QSize QVar2;
  bool bVar3;
  bool bVar4;
  Representation RVar5;
  QSize QVar6;
  QSize QVar7;
  ulong uVar8;
  Representation RVar9;
  Representation RVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  Representation RVar14;
  long lVar15;
  ulong uVar16;
  QDockAreaLayoutItem *this_00;
  uint local_48;
  
  uVar16 = 0;
  lVar15 = 0;
  do {
    uVar12 = 0xffffff;
    if ((ulong)(this->item_list).d.size <= uVar16) {
      uVar16 = 0xffffff;
      goto LAB_003f4cd4;
    }
    bVar3 = QDockAreaLayoutItem::skip
                      ((QDockAreaLayoutItem *)
                       ((long)&((this->item_list).d.ptr)->widgetItem + lVar15));
    lVar15 = lVar15 + 0x28;
    uVar16 = uVar16 + 1;
  } while (bVar3);
  uVar16 = 0xffffff;
  if (lVar15 != 0) {
    local_48 = 0;
    uVar13 = 0xffffff;
    uVar12 = 0;
    if (this->tabbed != false) {
      uVar12 = 0xffffff;
    }
    if ((this->item_list).d.size != 0) {
      lVar15 = 0;
      bVar3 = true;
      uVar16 = 0;
      local_48 = 0;
      do {
        iVar11 = (int)uVar12;
        this_00 = (QDockAreaLayoutItem *)((long)&((this->item_list).d.ptr)->widgetItem + lVar15);
        bVar4 = QDockAreaLayoutItem::skip(this_00);
        if (!bVar4) {
          QVar6 = QDockAreaLayoutItem::maximumSize(this_00);
          OVar1 = this->o;
          QVar7 = QDockAreaLayoutItem::minimumSize(this_00);
          QVar2 = (QSize)((ulong)QVar7 >> 0x20);
          if (OVar1 == Vertical) {
            QVar2 = QVar7;
          }
          RVar9.m_i = QVar2.wd.m_i.m_i;
          if (QVar2.wd.m_i.m_i < (int)local_48) {
            RVar9.m_i = local_48;
          }
          RVar14 = QVar6.ht.m_i;
          RVar10 = QVar6.wd.m_i;
          if (this->tabbed == true) {
            RVar5.m_i = RVar14.m_i;
            if (this->o == Horizontal) {
              RVar5.m_i = RVar10.m_i;
            }
            if (RVar5.m_i <= iVar11) {
              uVar12 = (ulong)(uint)RVar5.m_i;
            }
          }
          else {
            if (!bVar3) {
              iVar11 = iVar11 + *this->sep;
            }
            RVar5.m_i = RVar14.m_i;
            if (this->o == Horizontal) {
              RVar5.m_i = RVar10.m_i;
            }
            uVar12 = (ulong)(uint)(iVar11 + RVar5.m_i);
          }
          if (this->o == Vertical) {
            RVar14.m_i = RVar10.m_i;
          }
          if ((int)uVar13 < RVar14.m_i) {
            RVar14.m_i = uVar13;
          }
          uVar13 = RVar14.m_i;
          if (0xfffffe < (int)uVar12) {
            uVar12 = 0xffffff;
          }
          if (0xfffffe < (int)uVar13) {
            uVar13 = 0xffffff;
          }
          bVar3 = false;
          local_48 = RVar9.m_i;
        }
        uVar16 = uVar16 + 1;
        lVar15 = lVar15 + 0x28;
      } while (uVar16 < (ulong)(this->item_list).d.size);
    }
    if ((int)local_48 < (int)uVar13) {
      local_48 = uVar13;
    }
    uVar16 = 0xffffffff;
    if (this->o == Horizontal) {
      uVar16 = uVar12;
    }
    if (this->o == Vertical) {
      uVar16 = (ulong)local_48;
    }
    else {
      uVar12 = (ulong)local_48;
    }
    bVar3 = updateTabBar(this);
    if (bVar3) {
      uVar8 = (**(code **)(*(long *)&this->tabBar->super_QWidget + 0x70))();
    }
    else {
      uVar8 = 0;
    }
    if (uVar8 >> 0x20 != 0 || (int)uVar8 != 0) {
      if (this->tabBarShape - 2U < 2) {
        uVar16 = (ulong)(uint)((int)uVar16 + (int)uVar8);
      }
      else if ((uint)this->tabBarShape < 2) {
        uVar12 = (ulong)(uint)((int)uVar12 + (int)(uVar8 >> 0x20));
      }
    }
  }
LAB_003f4cd4:
  return (QSize)(uVar16 | uVar12 << 0x20);
}

Assistant:

QSize QDockAreaLayoutInfo::maximumSize() const
{
    if (isEmpty())
        return QSize(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX);

    int a = 0, b = QWIDGETSIZE_MAX;
#if QT_CONFIG(tabbar)
    if (tabbed)
        a = QWIDGETSIZE_MAX;
#endif

    int min_perp = 0;

    bool first = true;
    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.skip())
            continue;

        QSize max_size = item.maximumSize();
        min_perp = qMax(min_perp, perp(o, item.minimumSize()));

#if QT_CONFIG(tabbar)
        if (tabbed) {
            a = qMin(a, pick(o, max_size));
        } else
#endif
        {
            if (!first)
                a += *sep;
            a += pick(o, max_size);
        }
        b = qMin(b, perp(o, max_size));

        a = qMin(a, int(QWIDGETSIZE_MAX));
        b = qMin(b, int(QWIDGETSIZE_MAX));

        first = false;
    }

    b = qMax(b, min_perp);

    QSize result;
    rpick(o, result) = a;
    rperp(o, result) = b;

#if QT_CONFIG(tabbar)
    QSize tbh = tabBarSizeHint();
    if (!tbh.isNull()) {
        switch (tabBarShape) {
            case QTabBar::RoundedNorth:
            case QTabBar::RoundedSouth:
                result.rheight() += tbh.height();
                break;
            case QTabBar::RoundedEast:
            case QTabBar::RoundedWest:
                result.rwidth() += tbh.width();
                break;
            default:
                break;
        }
    }
#endif // QT_CONFIG(tabbar)

    return result;
}